

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O2

int FsPutFileW(WCHAR *LocalName,WCHAR *RemoteName,int CopyFlags)

{
  int iVar1;
  char16_t local_2b2;
  wcharstring wRemoteName;
  string local_290;
  wcharstring wLocalName;
  string local_250;
  ifstream ifs;
  byte abStack_210 [488];
  
  if ((CopyFlags & 2U) == 0) {
    std::ifstream::ifstream(&ifs);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::basic_string(&wRemoteName,RemoteName,(allocator<unsigned_short> *)&wLocalName);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::basic_string(&wLocalName,LocalName,(allocator<unsigned_short> *)&local_290);
    local_290._M_dataplus._M_p._0_2_ = 0x5c;
    local_2b2 = L'/';
    std::
    replace<__gnu_cxx::__normal_iterator<unsigned_short*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>,char16_t>
              ((__normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                )wRemoteName._M_dataplus._M_p,
               (__normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                )(wRemoteName._M_dataplus._M_p + wRemoteName._M_string_length),
               (char16_t *)&local_290,&local_2b2);
    toUTF8_abi_cxx11_(&local_290,wLocalName._M_dataplus._M_p);
    std::ifstream::open((string *)&ifs,(_Ios_Openmode)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    if ((abStack_210[*(long *)(_ifs + -0x18)] & 5) == 0) {
      iVar1 = (*gProgressProcW)(gPluginNumber,LocalName,RemoteName,0);
      if (iVar1 == 0) {
        toUTF8_abi_cxx11_(&local_250,wRemoteName._M_dataplus._M_p);
        YdiskRestClient::uploadFile(&rest_client,&local_250,&ifs,CopyFlags & 1);
        std::__cxx11::string::~string((string *)&local_250);
        (*gProgressProcW)(gPluginNumber,LocalName,RemoteName,100);
        std::ifstream::close();
        iVar1 = 0;
        if ((CopyFlags & 4U) != 0) {
          toUTF8_abi_cxx11_(&local_290,LocalName);
          remove((char *)CONCAT62(local_290._M_dataplus._M_p._2_6_,local_290._M_dataplus._M_p._0_2_)
                );
          std::__cxx11::string::~string((string *)&local_290);
        }
      }
      else {
        iVar1 = 5;
      }
    }
    else {
      iVar1 = 3;
    }
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~basic_string(&wLocalName);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~basic_string(&wRemoteName);
    std::ifstream::~ifstream(&ifs);
  }
  else {
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int DCPCALL FsPutFileW(WCHAR* LocalName,WCHAR* RemoteName,int CopyFlags) {
    if (CopyFlags & FS_COPYFLAGS_RESUME)
        return FS_FILE_NOTSUPPORTED;

    try {
        std::ifstream ifs;
        wcharstring wRemoteName(RemoteName), wLocalName(LocalName);
        std::replace(wRemoteName.begin(), wRemoteName.end(), u'\\', u'/');
        ifs.open(toUTF8(wLocalName.data()), std::ios::binary | std::ofstream::in);
        if (!ifs || ifs.bad())
            return FS_FILE_READERROR;

        int err = gProgressProcW(gPluginNumber, LocalName, RemoteName, 0);
        if (err)
            return FS_FILE_USERABORT;
        rest_client.uploadFile(toUTF8(wRemoteName.data()), ifs, (CopyFlags & FS_COPYFLAGS_OVERWRITE));
        gProgressProcW(gPluginNumber, LocalName, RemoteName, 100);

        ifs.close();

        if(CopyFlags & FS_COPYFLAGS_MOVE)
            std::remove(toUTF8(LocalName).c_str());

    } catch(rest_client_exception & e){
        if(e.get_status() == 409){
            return FS_FILE_EXISTS;
        } else {
            gRequestProcW(gPluginNumber, RT_MsgOK, (WCHAR*)u"Error", (WCHAR*) fromUTF8(e.what()).c_str(), NULL, 0);
            return FS_FILE_WRITEERROR;
        }
    } catch (std::runtime_error & e){
        gRequestProcW(gPluginNumber, RT_MsgOK, (WCHAR*)u"Error", (WCHAR*) fromUTF8(e.what()).c_str(), NULL, 0);
        return FS_FILE_WRITEERROR;
    }

    return FS_FILE_OK;
}